

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph_color.hpp
# Opt level: O0

void __thiscall
optimization::graph_color::Conflict_Map::Conflict_Map
          (Conflict_Map *this,
          shared_ptr<std::map<mir::inst::VarId,_int,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_int>_>_>_>
          *color_map,MirFunction *func,u_int color_num)

{
  bool bVar1;
  uint32_t uVar2;
  size_type sVar3;
  pointer ppVar4;
  pointer pIVar5;
  size_type sVar6;
  ostream *os;
  Timestamp *timestamp;
  ostream *poVar7;
  uint in_ECX;
  long in_RDX;
  Conflict_Map *in_RSI;
  long in_RDI;
  VarId *var2;
  VarId *var1;
  pair<std::_Rb_tree_const_iterator<int>,_bool> pVar8;
  VarId var_2;
  iterator __end3_1;
  iterator __begin3_1;
  set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_> *__range3_1;
  pair<const_mir::inst::VarId,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>_>
  *pair;
  iterator __end2_1;
  iterator __begin2_1;
  map<mir::inst::VarId,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>_>_>_>
  *__range2_1;
  VarId var_1;
  iterator __end5_1;
  iterator __begin5_1;
  set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_> *__range5_1;
  VarId var;
  iterator __end5;
  iterator __begin5;
  set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_> *__range5;
  VarId new_VarId;
  unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *inst;
  iterator __end3;
  iterator __begin3;
  vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
  *__range3;
  pair<const_int,_mir::inst::BasicBlk> *blkiter;
  iterator __end2;
  iterator __begin2;
  map<int,_mir::inst::BasicBlk,_std::less<int>,_std::allocator<std::pair<const_int,_mir::inst::BasicBlk>_>_>
  *__range2;
  iterator end_iter;
  int i;
  Conflict_Map *in_stack_fffffffffffff988;
  Function *in_stack_fffffffffffff990;
  string *in_stack_fffffffffffff998;
  Function *in_stack_fffffffffffff9a0;
  key_type *in_stack_fffffffffffff9a8;
  set<int,_std::less<int>,_std::allocator<int>_> *in_stack_fffffffffffff9b0;
  Function *in_stack_fffffffffffff9b8;
  ostream *in_stack_fffffffffffff9c0;
  allocator<char> *in_stack_fffffffffffff9c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff9d0;
  int in_stack_fffffffffffffa88;
  undefined4 in_stack_fffffffffffffa8c;
  _Rb_tree_const_iterator<int> in_stack_fffffffffffffa90;
  undefined1 local_509 [40];
  undefined1 local_4e1 [121];
  time_point_sys_clock local_468;
  Timestamp local_460 [3];
  undefined1 local_412;
  allocator<char> local_411;
  string local_410 [39];
  undefined1 local_3e9 [121];
  time_point_sys_clock local_370;
  Timestamp local_368 [3];
  undefined1 local_319;
  _Self local_308;
  _Self local_300;
  set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_> *local_2f8;
  allocator<char> local_2e9;
  string local_2e8 [39];
  allocator<char> local_2c1;
  string local_2c0 [120];
  time_point_sys_clock local_248;
  Timestamp local_240 [3];
  undefined1 local_1f1;
  reference local_1f0;
  _Self local_1e8;
  _Self local_1e0;
  long local_1d8;
  _Self local_1a0;
  _Self local_198;
  undefined1 local_190 [48];
  undefined1 *local_160;
  undefined4 local_114;
  _Self local_110;
  _Self local_108;
  undefined1 local_100 [48];
  undefined1 *local_d0;
  int local_c0;
  reference local_b8;
  unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *local_b0;
  __normal_iterator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_*,_std::vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>_>
  local_a8;
  vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
  *local_a0;
  reference local_98;
  _Self local_90;
  _Self local_88;
  long local_80;
  VarId local_78;
  _Base_ptr local_68;
  _Base_ptr local_60;
  _Base_ptr local_58;
  undefined1 local_50;
  uint local_44;
  uint local_1c;
  long local_18;
  
  local_1c = in_ECX;
  local_18 = in_RDX;
  std::
  map<mir::inst::VarId,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>_>_>_>
  ::map((map<mir::inst::VarId,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>_>_>_>
         *)0x1a81be);
  std::
  map<mir::inst::VarId,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>_>_>_>
  ::map((map<mir::inst::VarId,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>_>_>_>
         *)0x1a81d7);
  std::
  map<mir::inst::VarId,_mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_mir::inst::VarId>_>_>
  ::map((map<mir::inst::VarId,_mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_mir::inst::VarId>_>_>
         *)0x1a81f0);
  std::
  map<mir::inst::VarId,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>_>_>_>
  ::map((map<mir::inst::VarId,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>_>_>_>
         *)0x1a820c);
  std::
  map<unsigned_int,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>_>_>_>
  ::map((map<unsigned_int,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>_>_>_>
         *)0x1a8228);
  std::stack<mir::inst::VarId,std::deque<mir::inst::VarId,std::allocator<mir::inst::VarId>>>::
  stack<std::deque<mir::inst::VarId,std::allocator<mir::inst::VarId>>,void>
            ((stack<mir::inst::VarId,_std::deque<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>
              *)in_stack_fffffffffffff990);
  std::
  shared_ptr<std::map<mir::inst::VarId,_int,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_int>_>_>_>
  ::shared_ptr((shared_ptr<std::map<mir::inst::VarId,_int,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_int>_>_>_>
                *)in_stack_fffffffffffff990,
               (shared_ptr<std::map<mir::inst::VarId,_int,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_int>_>_>_>
                *)in_stack_fffffffffffff988);
  var2 = (VarId *)(in_RDI + 0x150);
  std::shared_ptr<std::set<int,_std::less<int>,_std::allocator<int>_>_>::shared_ptr
            ((shared_ptr<std::set<int,_std::less<int>,_std::allocator<int>_>_> *)0x1a8286);
  var1 = (VarId *)(in_RDI + 0x160);
  std::
  map<mir::inst::VarId,_int,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_int>_>_>
  ::map((map<mir::inst::VarId,_int,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_int>_>_>
         *)0x1a82a2);
  *(long *)(in_RDI + 400) = local_18;
  *(uint *)(in_RDI + 0x19c) = local_1c;
  std::make_shared<std::set<int,std::less<int>,std::allocator<int>>>();
  std::shared_ptr<std::set<int,_std::less<int>,_std::allocator<int>_>_>::operator=
            ((shared_ptr<std::set<int,_std::less<int>,_std::allocator<int>_>_> *)
             in_stack_fffffffffffff990,
             (shared_ptr<std::set<int,_std::less<int>,_std::allocator<int>_>_> *)
             in_stack_fffffffffffff988);
  std::shared_ptr<std::set<int,_std::less<int>,_std::allocator<int>_>_>::~shared_ptr
            ((shared_ptr<std::set<int,_std::less<int>,_std::allocator<int>_>_> *)0x1a82fe);
  for (local_44 = 0; local_44 < local_1c; local_44 = local_44 + 1) {
    std::
    __shared_ptr_access<std::set<int,_std::less<int>,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
    ::operator->((__shared_ptr_access<std::set<int,_std::less<int>,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0x1a8331);
    pVar8 = std::set<int,_std::less<int>,_std::allocator<int>_>::insert
                      (in_stack_fffffffffffff9b0,(value_type_conflict3 *)in_stack_fffffffffffff9a8);
    in_stack_fffffffffffffa90 = pVar8.first._M_node;
    local_50 = pVar8.second;
    in_stack_fffffffffffffa8c = CONCAT13(local_50,(int3)in_stack_fffffffffffffa8c);
    local_58 = in_stack_fffffffffffffa90._M_node;
  }
  sVar3 = std::
          map<unsigned_int,_mir::inst::Variable,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_mir::inst::Variable>_>_>
          ::size((map<unsigned_int,_mir::inst::Variable,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_mir::inst::Variable>_>_>
                  *)0x1a83c6);
  if (sVar3 == 0) {
    mir::inst::VarId::VarId
              ((VarId *)in_stack_fffffffffffff990,
               (uint32_t)((ulong)in_stack_fffffffffffff988 >> 0x20));
    uVar2 = mir::inst::VarId::operator_cast_to_unsigned_int(&local_78);
    *(uint32_t *)(in_RDI + 0x198) = uVar2;
  }
  else {
    local_60 = (_Base_ptr)
               std::
               map<unsigned_int,_mir::inst::Variable,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_mir::inst::Variable>_>_>
               ::end((map<unsigned_int,_mir::inst::Variable,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_mir::inst::Variable>_>_>
                      *)in_stack_fffffffffffff988);
    local_68 = (_Base_ptr)
               std::_Rb_tree_iterator<std::pair<const_unsigned_int,_mir::inst::Variable>_>::
               operator--((_Rb_tree_iterator<std::pair<const_unsigned_int,_mir::inst::Variable>_> *)
                          in_stack_fffffffffffff998,(int)((ulong)in_stack_fffffffffffff990 >> 0x20))
    ;
    ppVar4 = std::_Rb_tree_iterator<std::pair<const_unsigned_int,_mir::inst::Variable>_>::operator->
                       ((_Rb_tree_iterator<std::pair<const_unsigned_int,_mir::inst::Variable>_> *)
                        0x1a8409);
    *(uint *)(in_RDI + 0x198) = ppVar4->first;
  }
  local_80 = local_18 + 0x68;
  local_88._M_node =
       (_Base_ptr)
       std::
       map<int,_mir::inst::BasicBlk,_std::less<int>,_std::allocator<std::pair<const_int,_mir::inst::BasicBlk>_>_>
       ::begin((map<int,_mir::inst::BasicBlk,_std::less<int>,_std::allocator<std::pair<const_int,_mir::inst::BasicBlk>_>_>
                *)in_stack_fffffffffffff988);
  local_90._M_node =
       (_Base_ptr)
       std::
       map<int,_mir::inst::BasicBlk,_std::less<int>,_std::allocator<std::pair<const_int,_mir::inst::BasicBlk>_>_>
       ::end((map<int,_mir::inst::BasicBlk,_std::less<int>,_std::allocator<std::pair<const_int,_mir::inst::BasicBlk>_>_>
              *)in_stack_fffffffffffff988);
  do {
    bVar1 = std::operator!=(&local_88,&local_90);
    if (!bVar1) {
      local_1d8 = in_RDI + 0x90;
      local_1e0._M_node =
           (_Base_ptr)
           std::
           map<mir::inst::VarId,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>_>_>_>
           ::begin(&in_stack_fffffffffffff988->static_Map);
      local_1e8._M_node =
           (_Base_ptr)
           std::
           map<mir::inst::VarId,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>_>_>_>
           ::end(&in_stack_fffffffffffff988->static_Map);
      while (bVar1 = std::operator!=(&local_1e0,&local_1e8), bVar1) {
        local_1f0 = std::
                    _Rb_tree_iterator<std::pair<const_mir::inst::VarId,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>_>_>
                    ::operator*((_Rb_tree_iterator<std::pair<const_mir::inst::VarId,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>_>_>
                                 *)0x1a8a04);
        local_1f1 = 0;
        os = AixLog::operator<<((ostream *)in_stack_fffffffffffffa90._M_node,
                                (Severity *)
                                CONCAT44(in_stack_fffffffffffffa8c,in_stack_fffffffffffffa88));
        AixLog::Tag::Tag((Tag *)0x1a8a3f);
        timestamp = (Timestamp *)
                    AixLog::operator<<(in_stack_fffffffffffff9c0,(Tag *)in_stack_fffffffffffff9b8);
        local_248.__d.__r = (duration)std::chrono::_V2::system_clock::now();
        AixLog::Timestamp::Timestamp(local_240,&local_248);
        AixLog::operator<<(os,timestamp);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (in_stack_fffffffffffff9d0,(char *)in_stack_fffffffffffff9c8,
                   (allocator<char> *)in_stack_fffffffffffff9c0);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (in_stack_fffffffffffff9d0,(char *)in_stack_fffffffffffff9c8,
                   (allocator<char> *)in_stack_fffffffffffff9c0);
        AixLog::Function::Function
                  (in_stack_fffffffffffff9a0,in_stack_fffffffffffff998,
                   (string *)in_stack_fffffffffffff990,(size_t)in_stack_fffffffffffff988);
        AixLog::operator<<(in_stack_fffffffffffff9c0,in_stack_fffffffffffff9b8);
        poVar7 = prelude::operator<<((ostream *)in_stack_fffffffffffff990,
                                     (Displayable *)in_stack_fffffffffffff988);
        std::operator<<(poVar7," representes these vars : ");
        AixLog::Function::~Function(in_stack_fffffffffffff990);
        std::__cxx11::string::~string(local_2e8);
        std::allocator<char>::~allocator(&local_2e9);
        std::__cxx11::string::~string(local_2c0);
        std::allocator<char>::~allocator(&local_2c1);
        AixLog::Timestamp::~Timestamp(local_240);
        AixLog::Tag::~Tag((Tag *)0x1a8bca);
        local_2f8 = &local_1f0->second;
        local_300._M_node =
             (_Base_ptr)
             std::
             set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>::
             begin((set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
                    *)in_stack_fffffffffffff988);
        local_308._M_node =
             (_Base_ptr)
             std::
             set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>::
             end((set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
                  *)in_stack_fffffffffffff988);
        while (bVar1 = std::operator!=(&local_300,&local_308), bVar1) {
          std::_Rb_tree_const_iterator<mir::inst::VarId>::operator*
                    ((_Rb_tree_const_iterator<mir::inst::VarId> *)0x1a8c33);
          mir::inst::VarId::VarId
                    ((VarId *)in_stack_fffffffffffff990,(VarId *)in_stack_fffffffffffff988);
          local_319 = 0;
          AixLog::operator<<((ostream *)in_stack_fffffffffffffa90._M_node,
                             (Severity *)
                             CONCAT44(in_stack_fffffffffffffa8c,in_stack_fffffffffffffa88));
          AixLog::Tag::Tag((Tag *)0x1a8c73);
          AixLog::operator<<(in_stack_fffffffffffff9c0,(Tag *)in_stack_fffffffffffff9b8);
          local_370.__d.__r = (duration)std::chrono::_V2::system_clock::now();
          AixLog::Timestamp::Timestamp(local_368,&local_370);
          AixLog::operator<<(os,timestamp);
          in_stack_fffffffffffff9d0 =
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3e9;
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    (in_stack_fffffffffffff9d0,(char *)in_stack_fffffffffffff9c8,
                     (allocator<char> *)in_stack_fffffffffffff9c0);
          in_stack_fffffffffffff9c8 = &local_411;
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    (in_stack_fffffffffffff9d0,(char *)in_stack_fffffffffffff9c8,
                     (allocator<char> *)in_stack_fffffffffffff9c0);
          AixLog::Function::Function
                    (in_stack_fffffffffffff9a0,in_stack_fffffffffffff998,
                     (string *)in_stack_fffffffffffff990,(size_t)in_stack_fffffffffffff988);
          in_stack_fffffffffffff9c0 =
               AixLog::operator<<(in_stack_fffffffffffff9c0,in_stack_fffffffffffff9b8);
          in_stack_fffffffffffff9b8 =
               (Function *)
               prelude::operator<<((ostream *)in_stack_fffffffffffff990,
                                   (Displayable *)in_stack_fffffffffffff988);
          std::operator<<((ostream *)in_stack_fffffffffffff9b8,", ");
          AixLog::Function::~Function(in_stack_fffffffffffff990);
          std::__cxx11::string::~string(local_410);
          std::allocator<char>::~allocator(&local_411);
          std::__cxx11::string::~string((string *)(local_3e9 + 1));
          std::allocator<char>::~allocator((allocator<char> *)local_3e9);
          AixLog::Timestamp::~Timestamp(local_368);
          AixLog::Tag::~Tag((Tag *)0x1a8de9);
          std::_Rb_tree_const_iterator<mir::inst::VarId>::operator++
                    ((_Rb_tree_const_iterator<mir::inst::VarId> *)in_stack_fffffffffffff990);
        }
        local_412 = 0;
        AixLog::operator<<((ostream *)in_stack_fffffffffffffa90._M_node,
                           (Severity *)CONCAT44(in_stack_fffffffffffffa8c,in_stack_fffffffffffffa88)
                          );
        AixLog::Tag::Tag((Tag *)0x1a8ffb);
        AixLog::operator<<(in_stack_fffffffffffff9c0,(Tag *)in_stack_fffffffffffff9b8);
        local_468.__d.__r = (duration)std::chrono::_V2::system_clock::now();
        AixLog::Timestamp::Timestamp(local_460,&local_468);
        in_stack_fffffffffffff9a0 = (Function *)AixLog::operator<<(os,timestamp);
        in_stack_fffffffffffff998 = (string *)local_4e1;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (in_stack_fffffffffffff9d0,(char *)in_stack_fffffffffffff9c8,
                   (allocator<char> *)in_stack_fffffffffffff9c0);
        in_stack_fffffffffffff990 = (Function *)local_509;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (in_stack_fffffffffffff9d0,(char *)in_stack_fffffffffffff9c8,
                   (allocator<char> *)in_stack_fffffffffffff9c0);
        AixLog::Function::Function
                  (in_stack_fffffffffffff9a0,in_stack_fffffffffffff998,
                   (string *)in_stack_fffffffffffff990,(size_t)in_stack_fffffffffffff988);
        in_stack_fffffffffffff988 =
             (Conflict_Map *)AixLog::operator<<(in_stack_fffffffffffff9c0,in_stack_fffffffffffff9b8)
        ;
        std::ostream::operator<<(in_stack_fffffffffffff988,std::endl<char,std::char_traits<char>>);
        AixLog::Function::~Function(in_stack_fffffffffffff990);
        std::__cxx11::string::~string((string *)(local_509 + 1));
        std::allocator<char>::~allocator((allocator<char> *)local_509);
        std::__cxx11::string::~string((string *)(local_4e1 + 1));
        std::allocator<char>::~allocator((allocator<char> *)local_4e1);
        AixLog::Timestamp::~Timestamp(local_460);
        AixLog::Tag::~Tag((Tag *)0x1a9156);
        std::
        _Rb_tree_iterator<std::pair<const_mir::inst::VarId,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>_>_>
        ::operator++((_Rb_tree_iterator<std::pair<const_mir::inst::VarId,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>_>_>
                      *)in_stack_fffffffffffff990);
      }
      return;
    }
    local_98 = std::_Rb_tree_iterator<std::pair<const_int,_mir::inst::BasicBlk>_>::operator*
                         ((_Rb_tree_iterator<std::pair<const_int,_mir::inst::BasicBlk>_> *)0x1a84b8)
    ;
    local_a0 = &(local_98->second).inst;
    local_a8._M_current =
         (unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *)
         std::
         vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
         ::begin((vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
                  *)in_stack_fffffffffffff988);
    local_b0 = (unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *)
               std::
               vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
               ::end((vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
                      *)in_stack_fffffffffffff988);
    while (bVar1 = __gnu_cxx::operator!=
                             ((__normal_iterator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_*,_std::vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>_>
                               *)in_stack_fffffffffffff990,
                              (__normal_iterator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_*,_std::vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>_>
                               *)in_stack_fffffffffffff988), bVar1) {
      local_b8 = __gnu_cxx::
                 __normal_iterator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_*,_std::vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>_>
                 ::operator*(&local_a8);
      pIVar5 = std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>::operator->
                         ((unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *)
                          0x1a8542);
      in_stack_fffffffffffffa88 = (*(pIVar5->super_Displayable)._vptr_Displayable[1])();
      if (in_stack_fffffffffffffa88 == 7) {
        mir::inst::VarId::VarId
                  ((VarId *)in_stack_fffffffffffff990,
                   (uint32_t)((ulong)in_stack_fffffffffffff988 >> 0x20));
        pIVar5 = std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>::operator->
                           ((unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *)
                            0x1a8585);
        (*(pIVar5->super_Displayable)._vptr_Displayable[2])(local_100);
        local_d0 = local_100;
        local_108._M_node =
             (_Base_ptr)
             std::
             set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>::
             begin((set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
                    *)in_stack_fffffffffffff988);
        local_110._M_node =
             (_Base_ptr)
             std::
             set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>::
             end((set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
                  *)in_stack_fffffffffffff988);
        while (bVar1 = std::operator!=(&local_108,&local_110), bVar1) {
          std::_Rb_tree_const_iterator<mir::inst::VarId>::operator*
                    ((_Rb_tree_const_iterator<mir::inst::VarId> *)0x1a860b);
          mir::inst::VarId::VarId
                    ((VarId *)in_stack_fffffffffffff990,(VarId *)in_stack_fffffffffffff988);
          sVar6 = std::
                  map<mir::inst::VarId,_mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_mir::inst::VarId>_>_>
                  ::count((map<mir::inst::VarId,_mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_mir::inst::VarId>_>_>
                           *)in_stack_fffffffffffff9a0,(key_type *)in_stack_fffffffffffff998);
          if (sVar6 != 0) {
            std::
            map<mir::inst::VarId,_mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_mir::inst::VarId>_>_>
            ::at((map<mir::inst::VarId,_mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_mir::inst::VarId>_>_>
                  *)in_stack_fffffffffffff9b0,in_stack_fffffffffffff9a8);
            mir::inst::VarId::operator=
                      ((VarId *)in_stack_fffffffffffff990,(VarId *)in_stack_fffffffffffff988);
            break;
          }
          std::_Rb_tree_const_iterator<mir::inst::VarId>::operator++
                    ((_Rb_tree_const_iterator<mir::inst::VarId> *)in_stack_fffffffffffff990);
        }
        local_114 = 9;
        std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>::
        ~set((set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
              *)0x1a86e0);
        if (local_c0 == 0) {
          std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>::operator->
                    ((unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *)0x1a870f)
          ;
          sVar6 = std::
                  map<mir::inst::VarId,_mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_mir::inst::VarId>_>_>
                  ::count((map<mir::inst::VarId,_mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_mir::inst::VarId>_>_>
                           *)in_stack_fffffffffffff9a0,(key_type *)in_stack_fffffffffffff998);
          if (sVar6 == 0) {
            get_new_VarId(in_stack_fffffffffffff988);
            mir::inst::VarId::operator=
                      ((VarId *)in_stack_fffffffffffff990,(VarId *)in_stack_fffffffffffff988);
          }
          else {
            std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>::operator->
                      ((unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *)
                       0x1a875c);
            std::
            map<mir::inst::VarId,_mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_mir::inst::VarId>_>_>
            ::at((map<mir::inst::VarId,_mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_mir::inst::VarId>_>_>
                  *)in_stack_fffffffffffff9b0,in_stack_fffffffffffff9a8);
            mir::inst::VarId::operator=
                      ((VarId *)in_stack_fffffffffffff990,(VarId *)in_stack_fffffffffffff988);
          }
        }
        std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>::operator->
                  ((unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *)0x1a87cc);
        mir::inst::VarId::VarId
                  ((VarId *)in_stack_fffffffffffff990,(VarId *)in_stack_fffffffffffff988);
        mir::inst::VarId::VarId
                  ((VarId *)in_stack_fffffffffffff990,(VarId *)in_stack_fffffffffffff988);
        merge(in_RSI,var1,var2);
        pIVar5 = std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>::operator->
                           ((unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *)
                            0x1a8831);
        (*(pIVar5->super_Displayable)._vptr_Displayable[2])(local_190);
        local_160 = local_190;
        local_198._M_node =
             (_Base_ptr)
             std::
             set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>::
             begin((set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
                    *)in_stack_fffffffffffff988);
        local_1a0._M_node =
             (_Base_ptr)
             std::
             set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>::
             end((set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
                  *)in_stack_fffffffffffff988);
        while (bVar1 = std::operator!=(&local_198,&local_1a0), bVar1) {
          std::_Rb_tree_const_iterator<mir::inst::VarId>::operator*
                    ((_Rb_tree_const_iterator<mir::inst::VarId> *)0x1a88c4);
          mir::inst::VarId::VarId
                    ((VarId *)in_stack_fffffffffffff990,(VarId *)in_stack_fffffffffffff988);
          mir::inst::VarId::VarId
                    ((VarId *)in_stack_fffffffffffff990,(VarId *)in_stack_fffffffffffff988);
          mir::inst::VarId::VarId
                    ((VarId *)in_stack_fffffffffffff990,(VarId *)in_stack_fffffffffffff988);
          merge(in_RSI,var1,var2);
          std::_Rb_tree_const_iterator<mir::inst::VarId>::operator++
                    ((_Rb_tree_const_iterator<mir::inst::VarId> *)in_stack_fffffffffffff990);
        }
        local_114 = 0xb;
        std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>::
        ~set((set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
              *)0x1a88b2);
      }
      __gnu_cxx::
      __normal_iterator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_*,_std::vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>_>
      ::operator++(&local_a8);
    }
    std::_Rb_tree_iterator<std::pair<const_int,_mir::inst::BasicBlk>_>::operator++
              ((_Rb_tree_iterator<std::pair<const_int,_mir::inst::BasicBlk>_> *)
               in_stack_fffffffffffff990);
  } while( true );
}

Assistant:

Conflict_Map(std::shared_ptr<Color_Map> color_map,
               mir::inst::MirFunction& func, u_int color_num = 8)
      : color_num(color_num), color_map(color_map), func(func) {
    unused_colors = std::make_shared<std::set<int>>();
    for (int i = 0; i < color_num; i++) {
      unused_colors->insert(i);
    }
    if (func.variables.size()) {
      auto end_iter = func.variables.end();
      end_iter--;
      varId = end_iter->first;
    } else {
      varId = mir::inst::VarId(65535);
    }
    for (auto& blkiter : func.basic_blks) {
      for (auto& inst : blkiter.second.inst) {
        if (inst->inst_kind() == mir::inst::InstKind::Phi) {
          mir::inst::VarId new_VarId(0);
          for (auto var : inst->useVars()) {
            if (merged_var_Map.count(var)) {
              new_VarId = merged_var_Map.at(var);
              break;
            }
          }
          if (new_VarId.id == 0) {
            if (merged_var_Map.count(inst->dest)) {
              new_VarId = merged_var_Map.at(inst->dest);
            } else {
              new_VarId = get_new_VarId();
            }
          }
          merge(inst->dest, new_VarId);
          for (auto var : inst->useVars()) {
            merge(var, new_VarId);
          }
          // LOG(TRACE) << new_VarId << " : ";
          // for (auto var : inst->useVars()) {
          //   LOG(TRACE) << var << ", ";
          // }
          // LOG(TRACE) << std::endl;
        }
      }
    }
    for (auto& pair : merged_Map) {
      LOG(TRACE) << pair.first << " representes these vars : ";
      for (auto var : pair.second) {
        LOG(TRACE) << var << ", ";
      }
      LOG(TRACE) << std::endl;
    }
  }